

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

_Bool ggml_are_same_shape(ggml_tensor *t0,ggml_tensor *t1)

{
  if (((t0->ne[0] == t1->ne[0]) && (t0->ne[1] == t1->ne[1])) && (t0->ne[2] == t1->ne[2])) {
    return t0->ne[3] == t1->ne[3];
  }
  return false;
}

Assistant:

bool ggml_are_same_shape(const struct ggml_tensor * t0, const struct ggml_tensor * t1) {
    static_assert(GGML_MAX_DIMS == 4, "GGML_MAX_DIMS is not 4 - update this function");

    return
        (t0->ne[0] == t1->ne[0]) &&
        (t0->ne[1] == t1->ne[1]) &&
        (t0->ne[2] == t1->ne[2]) &&
        (t0->ne[3] == t1->ne[3]);
}